

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O3

int main(void)

{
  int iVar1;
  nn_trie trie;
  nn_trie local_10;
  
  local_10.root = (nn_trie_node *)0x0;
  iVar1 = nn_trie_match(&local_10,"",0);
  if (iVar1 == 0) {
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABC",3);
    if (iVar1 != 0) goto LAB_00103859;
    nn_node_term((nn_trie_node *)0x0);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,"",0);
    if (iVar1 == 0) goto LAB_0010385e;
    iVar1 = nn_trie_match(&local_10,"",0);
    if (iVar1 == 0) goto LAB_00103863;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABC",3);
    if (iVar1 == 0) goto LAB_00103868;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"ABC",3);
    if (iVar1 == 0) goto LAB_0010386d;
    iVar1 = nn_trie_match(&local_10,"DEF",3);
    if (iVar1 != 0) goto LAB_00103872;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"AB",2);
    if (iVar1 != 0) goto LAB_00103877;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABC",3);
    if (iVar1 == 0) goto LAB_0010387c;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABCDE",5);
    if (iVar1 == 0) goto LAB_00103881;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"01234567890123456789012345678901234",0x23);
    if (iVar1 == 0) goto LAB_00103886;
    iVar1 = nn_trie_match(&local_10,"",0);
    if (iVar1 != 0) goto LAB_0010388b;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"012456789",10);
    if (iVar1 != 0) goto LAB_00103890;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"012345678901234567",0x12);
    if (iVar1 != 0) goto LAB_00103895;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"01234567890123456789012345678901234",0x23);
    if (iVar1 == 0) goto LAB_0010389a;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"ABC",3);
    if (iVar1 == 0) goto LAB_0010389f;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"ADE",3);
    if (iVar1 == 0) goto LAB_001038a4;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"A",1);
    if (iVar1 != 0) goto LAB_001038a9;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"AD",2);
    if (iVar1 != 0) goto LAB_001038ae;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"A",1);
    if (iVar1 == 0) goto LAB_001038b3;
    iVar1 = nn_trie_subscribe(&local_10,"B",1);
    if (iVar1 == 0) goto LAB_001038b8;
    iVar1 = nn_trie_subscribe(&local_10,"C",1);
    if (iVar1 == 0) goto LAB_001038bd;
    iVar1 = nn_trie_subscribe(&local_10,"0",1);
    if (iVar1 == 0) goto LAB_001038c2;
    iVar1 = nn_trie_subscribe(&local_10,"E",1);
    if (iVar1 == 0) goto LAB_001038c7;
    iVar1 = nn_trie_subscribe(&local_10,"F",1);
    if (iVar1 == 0) goto LAB_001038cc;
    iVar1 = nn_trie_subscribe(&local_10,"1",1);
    if (iVar1 == 0) goto LAB_001038d1;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"@",1);
    if (iVar1 == 0) goto LAB_001038d6;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"b",1);
    if (iVar1 == 0) goto LAB_001038db;
    iVar1 = nn_trie_subscribe(&local_10,"f",1);
    if (iVar1 == 0) goto LAB_001038e0;
    iVar1 = nn_trie_match(&local_10,"0",1);
    if (iVar1 == 0) goto LAB_001038e5;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"A",1);
    if (iVar1 == 0) goto LAB_001038ea;
    iVar1 = nn_trie_match(&local_10,"f",1);
    if (iVar1 == 0) goto LAB_001038ef;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"000",3);
    if (iVar1 == 0) goto LAB_001038f4;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"a",1);
    if (iVar1 != 0) goto LAB_001038f9;
    iVar1 = nn_trie_match(&local_10,"c",1);
    if (iVar1 != 0) goto LAB_001038fe;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"ABCD",4);
    if (iVar1 == 0) goto LAB_00103903;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"AB",2);
    if (iVar1 == 0) goto LAB_00103908;
    iVar1 = nn_node_unsubscribe(&local_10.root,(uint8_t *)"AB",2);
    if (iVar1 != 1) goto LAB_0010390d;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"AB",2);
    if (iVar1 != 0) goto LAB_00103912;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABCDEF",6);
    if (iVar1 == 0) goto LAB_00103917;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"ABEF",4);
    if (iVar1 == 0) goto LAB_0010391c;
    iVar1 = nn_node_unsubscribe(&local_10.root,(uint8_t *)"ABCD",4);
    if (iVar1 != 1) goto LAB_00103921;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABCD",4);
    if (iVar1 != 0) goto LAB_00103926;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABEF",4);
    if (iVar1 == 0) goto LAB_0010392b;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"A",1);
    if (iVar1 == 0) goto LAB_00103930;
    iVar1 = nn_node_unsubscribe(&local_10.root,(uint8_t *)"A",1);
    if (iVar1 != 1) goto LAB_00103935;
    iVar1 = nn_trie_match(&local_10,"",0);
    if (iVar1 != 0) goto LAB_0010393a;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"A",1);
    if (iVar1 != 0) goto LAB_0010393f;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"A",1);
    if (iVar1 == 0) goto LAB_00103944;
    iVar1 = nn_trie_subscribe(&local_10,"B",1);
    if (iVar1 == 0) goto LAB_00103949;
    iVar1 = nn_trie_subscribe(&local_10,"C",1);
    if (iVar1 == 0) goto LAB_0010394e;
    iVar1 = nn_trie_subscribe(&local_10,"0",1);
    if (iVar1 == 0) goto LAB_00103953;
    iVar1 = nn_trie_subscribe(&local_10,"E",1);
    if (iVar1 == 0) goto LAB_00103958;
    iVar1 = nn_trie_subscribe(&local_10,"F",1);
    if (iVar1 == 0) goto LAB_0010395d;
    iVar1 = nn_trie_subscribe(&local_10,"1",1);
    if (iVar1 == 0) goto LAB_00103962;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"@",1);
    if (iVar1 == 0) goto LAB_00103967;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"b",1);
    if (iVar1 == 0) goto LAB_0010396c;
    iVar1 = nn_trie_subscribe(&local_10,"f",1);
    if (iVar1 == 0) goto LAB_00103971;
    iVar1 = nn_node_unsubscribe(&local_10.root,"0",1);
    if (iVar1 != 1) goto LAB_00103976;
    iVar1 = nn_node_unsubscribe(&local_10.root,"f",1);
    if (iVar1 != 1) goto LAB_0010397b;
    iVar1 = nn_node_unsubscribe(&local_10.root,"E",1);
    if (iVar1 != 1) goto LAB_00103980;
    iVar1 = nn_node_unsubscribe(&local_10.root,"B",1);
    if (iVar1 != 1) goto LAB_00103985;
    iVar1 = nn_node_unsubscribe(&local_10.root,(uint8_t *)"A",1);
    if (iVar1 != 1) goto LAB_0010398a;
    iVar1 = nn_node_unsubscribe(&local_10.root,"1",1);
    if (iVar1 != 1) goto LAB_0010398f;
    iVar1 = nn_node_unsubscribe(&local_10.root,(uint8_t *)"@",1);
    if (iVar1 != 1) goto LAB_00103994;
    iVar1 = nn_node_unsubscribe(&local_10.root,"F",1);
    if (iVar1 != 1) goto LAB_00103999;
    iVar1 = nn_node_unsubscribe(&local_10.root,"C",1);
    if (iVar1 == 1) {
      iVar1 = nn_node_unsubscribe(&local_10.root,(uint8_t *)"b",1);
      if (iVar1 == 1) {
        nn_node_term(local_10.root);
        return 0;
      }
      goto LAB_001039a3;
    }
  }
  else {
    main_cold_1();
LAB_00103859:
    main_cold_2();
LAB_0010385e:
    main_cold_68();
LAB_00103863:
    main_cold_67();
LAB_00103868:
    main_cold_66();
LAB_0010386d:
    main_cold_65();
LAB_00103872:
    main_cold_3();
LAB_00103877:
    main_cold_4();
LAB_0010387c:
    main_cold_64();
LAB_00103881:
    main_cold_63();
LAB_00103886:
    main_cold_62();
LAB_0010388b:
    main_cold_5();
LAB_00103890:
    main_cold_6();
LAB_00103895:
    main_cold_7();
LAB_0010389a:
    main_cold_61();
LAB_0010389f:
    main_cold_60();
LAB_001038a4:
    main_cold_59();
LAB_001038a9:
    main_cold_8();
LAB_001038ae:
    main_cold_9();
LAB_001038b3:
    main_cold_58();
LAB_001038b8:
    main_cold_57();
LAB_001038bd:
    main_cold_56();
LAB_001038c2:
    main_cold_55();
LAB_001038c7:
    main_cold_54();
LAB_001038cc:
    main_cold_53();
LAB_001038d1:
    main_cold_52();
LAB_001038d6:
    main_cold_51();
LAB_001038db:
    main_cold_50();
LAB_001038e0:
    main_cold_49();
LAB_001038e5:
    main_cold_48();
LAB_001038ea:
    main_cold_47();
LAB_001038ef:
    main_cold_46();
LAB_001038f4:
    main_cold_45();
LAB_001038f9:
    main_cold_10();
LAB_001038fe:
    main_cold_11();
LAB_00103903:
    main_cold_44();
LAB_00103908:
    main_cold_43();
LAB_0010390d:
    main_cold_12();
LAB_00103912:
    main_cold_13();
LAB_00103917:
    main_cold_42();
LAB_0010391c:
    main_cold_41();
LAB_00103921:
    main_cold_14();
LAB_00103926:
    main_cold_15();
LAB_0010392b:
    main_cold_40();
LAB_00103930:
    main_cold_39();
LAB_00103935:
    main_cold_16();
LAB_0010393a:
    main_cold_17();
LAB_0010393f:
    main_cold_18();
LAB_00103944:
    main_cold_38();
LAB_00103949:
    main_cold_37();
LAB_0010394e:
    main_cold_36();
LAB_00103953:
    main_cold_35();
LAB_00103958:
    main_cold_34();
LAB_0010395d:
    main_cold_33();
LAB_00103962:
    main_cold_32();
LAB_00103967:
    main_cold_31();
LAB_0010396c:
    main_cold_30();
LAB_00103971:
    main_cold_29();
LAB_00103976:
    main_cold_19();
LAB_0010397b:
    main_cold_20();
LAB_00103980:
    main_cold_21();
LAB_00103985:
    main_cold_22();
LAB_0010398a:
    main_cold_23();
LAB_0010398f:
    main_cold_24();
LAB_00103994:
    main_cold_25();
LAB_00103999:
    main_cold_26();
  }
  main_cold_27();
LAB_001039a3:
  main_cold_28();
}

Assistant:

int main ()
{
    int rc;
    struct nn_trie trie;

    /*  Try matching with an empty trie. */
    nn_trie_init (&trie);
    rc = nn_trie_match (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 0);
    nn_trie_term (&trie);

    /*  Try matching with "all" subscription. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    /*  Try some simple matching. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "DEF", 3);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "AB", 2);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABCDE", 5);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    /*  Try a long subcsription. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie,
        (const uint8_t*) "01234567890123456789012345678901234", 35);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "012456789", 10);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "012345678901234567", 18);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie,
        (const uint8_t*) "01234567890123456789012345678901234", 35);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    /*  Try matching with a sparse node involved. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ADE", 3);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "AD", 2);
    nn_assert (rc == 0);
    nn_trie_term (&trie);

    /*  Try matching with a dense node involved. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "B", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "C", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "0", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "E", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "F", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "1", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "@", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "b", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "f", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "0", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "f", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "000", 3);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "a", 1);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "c", 1);
    nn_assert (rc == 0);
    nn_trie_term (&trie);

    /*  Check prefix splitting and compaction. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ABCD", 4);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "AB", 2);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "AB", 2);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "AB", 2);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABCDEF", 6);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ABEF", 4);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "ABCD", 4);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABCD", 4);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABEF", 4);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    /*  Check whether there's no problem with removing all subscriptions. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 0);
    nn_trie_term (&trie);  

    /*  Check converting from sparse node to dense node and vice versa. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "B", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "C", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "0", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "E", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "F", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "1", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "@", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "b", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "f", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "0", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "f", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "E", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "B", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "1", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "@", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "F", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "C", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "b", 1);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    return 0;
}